

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::LiteralNumber::LiteralNumber(LiteralNumber *this,LiteralNumber *param_2)

{
  long in_RSI;
  AST *in_RDI;
  AST *unaff_retaddr;
  
  AST::AST(unaff_retaddr,in_RDI);
  in_RDI->_vptr_AST = (_func_int **)&PTR__LiteralNumber_003a0e08;
  in_RDI[1]._vptr_AST = *(_func_int ***)(in_RSI + 0x80);
  std::__cxx11::string::string((string *)&in_RDI[1].location,(string *)(in_RSI + 0x88));
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }